

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

void stripspe(obj *obj)

{
  char *pcVar1;
  char *pcVar2;
  obj *obj_local;
  
  if ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0) {
    if (obj->spe < '\x01') {
      pline("Nothing happens.");
    }
    else {
      obj->spe = '\0';
      if ((obj->otyp == 0xe8) || (obj->otyp == 0xe7)) {
        obj->age = 0;
      }
      pcVar1 = xname(obj);
      pcVar2 = otense(obj,"vibrate");
      pline("Your %s %s briefly.",pcVar1,pcVar2);
    }
  }
  else {
    pline("Nothing happens.");
  }
  return;
}

Assistant:

static void stripspe(struct obj *obj)
{
	if (obj->blessed) pline("Nothing happens.");
	else {
		if (obj->spe > 0) {
		    obj->spe = 0;
		    if (obj->otyp == OIL_LAMP || obj->otyp == BRASS_LANTERN)
			obj->age = 0;
		    pline("Your %s %s briefly.",xname(obj), otense(obj, "vibrate"));
		} else pline("Nothing happens.");
	}
}